

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O1

int __thiscall
icu_63::LocaleCacheKey<icu_63::SharedCalendar>::clone
          (LocaleCacheKey<icu_63::SharedCalendar> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  LocaleCacheKey<icu_63::SharedCalendar> *this_00;
  
  this_00 = (LocaleCacheKey<icu_63::SharedCalendar> *)
            UMemory::operator_new((UMemory *)0xf0,(size_t)__fn);
  if (this_00 == (LocaleCacheKey<icu_63::SharedCalendar> *)0x0) {
    this_00 = (LocaleCacheKey<icu_63::SharedCalendar> *)0x0;
  }
  else {
    LocaleCacheKey(this_00,this);
  }
  return (int)this_00;
}

Assistant:

virtual CacheKeyBase *clone() const {
       return new LocaleCacheKey<T>(*this);
   }